

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  bool bVar1;
  byte local_211;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  byte local_163;
  byte local_162;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  uint local_9c;
  undefined1 local_98 [8];
  string field_name;
  string local_70;
  allocator local_39;
  string local_38;
  ParserImpl *local_18;
  ParserImpl *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"[",&local_39);
  bVar1 = TryConsume(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar1) {
    bVar1 = ConsumeTypeUrlOrFullTypeName(this);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_0072968c;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"]",(allocator *)(field_name.field_2._M_local_buf + 0xf));
    bVar1 = ConsumeBeforeWhitespace(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)(field_name.field_2._M_local_buf + 0xf));
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_0072968c;
    }
  }
  else {
    std::__cxx11::string::string((string *)local_98);
    bVar1 = ConsumeIdentifierBeforeWhitespace(this,(string *)local_98);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    local_9c = (uint)!bVar1;
    std::__cxx11::string::~string((string *)local_98);
    if (local_9c != 0) goto LAB_0072968c;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"Unknown/Reserved",&local_c1);
  TryConsumeWhitespace(this,&local_c0,"n/a");
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,":",&local_e9);
  bVar1 = TryConsumeBeforeWhitespace(this,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"Unknown/Reserved",&local_111);
    TryConsumeWhitespace(this,&local_110,"n/a");
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::allocator<char>::allocator();
    local_162 = 0;
    local_163 = 0;
    std::__cxx11::string::string((string *)&local_138,"{",&local_139);
    bVar1 = LookingAt(this,&local_138);
    local_211 = 0;
    if (!bVar1) {
      std::allocator<char>::allocator();
      local_162 = 1;
      std::__cxx11::string::string((string *)&local_160,"<",&local_161);
      local_163 = 1;
      bVar1 = LookingAt(this,&local_160);
      local_211 = bVar1 ^ 0xff;
    }
    if ((local_163 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_160);
    }
    if ((local_162 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
    }
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    if ((local_211 & 1) == 0) {
      bVar1 = SkipFieldMessage(this);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0072968c;
      }
    }
    else {
      bVar1 = SkipFieldValue(this);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0072968c;
      }
    }
  }
  else {
    bVar1 = SkipFieldMessage(this);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_0072968c;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,";",&local_189);
  bVar1 = TryConsume(this,&local_188);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b0,",",&local_1b1);
    TryConsume(this,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  this_local._7_1_ = 1;
LAB_0072968c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SkipField() {
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName());
      DO(ConsumeBeforeWhitespace("]"));
    } else {
      std::string field_name;
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
    }
    TryConsumeWhitespace("Unknown/Reserved", "n/a");

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsumeBeforeWhitespace(":")) {
      TryConsumeWhitespace("Unknown/Reserved", "n/a");
      if (!LookingAt("{") && !LookingAt("<")) {
        DO(SkipFieldValue());
      } else {
        DO(SkipFieldMessage());
      }
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }